

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::NetSymbol::NetSymbol
          (NetSymbol *this,string_view name,SourceLocation loc,NetType *netType)

{
  string_view name_00;
  DeclaredType *pDVar1;
  ValueSymbol *in_RCX;
  SourceLocation in_RDX;
  undefined8 in_RSI;
  bitmask<slang::ast::DeclaredTypeFlags> bVar2;
  char *in_RDI;
  size_t in_R8;
  not_null<slang::ast::DeclaredType_*> dt;
  ValueSymbol *in_stack_ffffffffffffff98;
  bitmask<slang::ast::DeclaredTypeFlags> local_54;
  DeclaredType *local_50;
  bitmask<slang::ast::DeclaredTypeFlags> in_stack_ffffffffffffffbc;
  char *pcVar3;
  
  bVar2.m_bits = (underlying_type)((ulong)in_RSI >> 0x20);
  pcVar3 = in_RDI;
  bitmask<slang::ast::DeclaredTypeFlags>::bitmask
            ((bitmask<slang::ast::DeclaredTypeFlags> *)&stack0xffffffffffffffbc,NetType);
  name_00._M_str = pcVar3;
  name_00._M_len = in_R8;
  ValueSymbol::ValueSymbol(in_RCX,in_stack_ffffffffffffffbc.m_bits,name_00,in_RDX,bVar2);
  *(size_t *)(in_RDI + 0x150) = in_R8;
  in_RDI[0x158] = '\0';
  in_RDI[0x159] = '\0';
  in_RDI[0x15a] = '\0';
  in_RDI[0x15b] = '\0';
  in_RDI[0x15c] = '\0';
  std::optional<const_slang::ast::TimingControl_*>::optional
            ((optional<const_slang::ast::TimingControl_*> *)0x70ae85);
  bVar2.m_bits = (underlying_type)((ulong)in_RDI >> 0x20);
  local_50 = (DeclaredType *)ValueSymbol::getDeclaredType(in_stack_ffffffffffffff98);
  pDVar1 = not_null<slang::ast::DeclaredType_*>::operator->
                     ((not_null<slang::ast::DeclaredType_*> *)0x70ae9e);
  DeclaredType::setLink(pDVar1,(DeclaredType *)(in_R8 + 0x40));
  if (*(int *)(in_R8 + 0x80) == 0xd) {
    pDVar1 = not_null<slang::ast::DeclaredType_*>::operator->
                       ((not_null<slang::ast::DeclaredType_*> *)0x70aec7);
    bitmask<slang::ast::DeclaredTypeFlags>::bitmask(&local_54,InterconnectNet);
    DeclaredType::addFlags(pDVar1,bVar2);
  }
  return;
}

Assistant:

NetSymbol::NetSymbol(std::string_view name, SourceLocation loc, const NetType& netType) :
    ValueSymbol(SymbolKind::Net, name, loc, DeclaredTypeFlags::NetType), netType(netType) {

    auto dt = getDeclaredType();
    dt->setLink(netType.declaredType);
    if (netType.netKind == NetType::Interconnect)
        dt->addFlags(DeclaredTypeFlags::InterconnectNet);
}